

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sarimaxtest2.c
# Opt level: O0

int main(void)

{
  int N_00;
  int iVar1;
  void *__ptr;
  void *__ptr_00;
  void *__ptr_01;
  void *__ptr_02;
  double *xpred_00;
  double *amse_00;
  FILE *__stream;
  double *inp_00;
  sarimax_object obj_00;
  double dVar2;
  double temp [1200];
  FILE *ifp;
  int imean;
  sarimax_object obj;
  double *amse;
  double *xpred;
  double *THETA;
  double *PHI;
  double *theta;
  double *phi;
  int r;
  int s;
  int Q;
  int P;
  int q;
  int p;
  double *inp;
  int L;
  int D;
  int d;
  int N;
  int i;
  
  __ptr = malloc(0x10);
  __ptr_00 = malloc(0x10);
  __ptr_01 = malloc(8);
  __ptr_02 = malloc(8);
  xpred_00 = (double *)malloc(0x28);
  amse_00 = (double *)malloc(0x28);
  __stream = fopen("../data/seriesG.txt","r");
  d = 0;
  if (__stream != (FILE *)0x0) {
    while (N_00 = d, iVar1 = feof(__stream), iVar1 == 0) {
      __isoc99_fscanf(__stream,"%lf \n",temp + (long)d + -1);
      d = d + 1;
    }
    inp_00 = (double *)malloc((long)d << 3);
    for (d = 0; d < N_00; d = d + 1) {
      dVar2 = log(temp[(long)d + -1]);
      inp_00[d] = dVar2;
    }
    obj_00 = sarimax_init(2,1,2,1,1,1,0xc,0,1,N_00);
    sarimax_setMethod(obj_00,2);
    sarimax_exec(obj_00,inp_00,(double *)0x0);
    sarimax_summary(obj_00);
    sarimax_predict(obj_00,inp_00,(double *)0x0,5,(double *)0x0,xpred_00,amse_00);
    printf("\n");
    printf("Predicted Values : ");
    for (d = 0; d < 5; d = d + 1) {
      exp(xpred_00[d]);
      printf("%g ");
    }
    printf("\n");
    printf("Standard Errors  : ");
    for (d = 0; d < 5; d = d + 1) {
      sqrt(amse_00[d]);
      printf("%g ");
    }
    printf("\n");
    sarimax_free(obj_00);
    free(inp_00);
    free(__ptr);
    free(__ptr_00);
    free(__ptr_01);
    free(__ptr_02);
    free(xpred_00);
    free(amse_00);
    return 0;
  }
  printf("Cannot Open File");
  exit(100);
}

Assistant:

int main(void) {
	int i, N, d, D, L;
	double *inp;
	int p, q, P, Q, s, r;
	double *phi, *theta;
    double *PHI, *THETA;
	double *xpred, *amse;
	sarimax_object obj;
	int imean = 1;
    /*
    Make sure all the parameter values are correct and consistent with other values. eg., if xreg is NULL r should be 0
    or if P = D = Q = 0 then make sure that s is also 0. 
     Recheck the values if the program fails to execute.
    */
	p = 2;
	d = 1;
	q = 2;
	s = 12;
	P = 1;
	D = 1;
	Q = 1;
	r = 0;


	L = 5;

	phi = (double*)malloc(sizeof(double)* p);
	theta = (double*)malloc(sizeof(double)* q);
    PHI = (double*)malloc(sizeof(double)* P);
	THETA = (double*)malloc(sizeof(double)* Q);

	xpred = (double*)malloc(sizeof(double)* L);
	amse = (double*)malloc(sizeof(double)* L);

	FILE *ifp;
	double temp[1200];

	ifp = fopen("../data/seriesG.txt", "r");
	i = 0;
	if (!ifp) {
		printf("Cannot Open File");
		exit(100);
	}
	while (!feof(ifp)) {
		fscanf(ifp, "%lf \n", &temp[i]);
		i++;
	}
	N = i;

	inp = (double*)malloc(sizeof(double)* N);

    /*
    
    */

	for (i = 0; i < N; ++i) {
		inp[i] = log(temp[i]);
	}


	obj = sarimax_init(p, d, q, P, D, Q, s, r ,imean, N);

    /* setMethod()
    Method 0 ("CSS-MLE") is default. The method also accepts values 1 ("MLE") and 2 ("CSS")
    */

	sarimax_setMethod(obj, 2); 

    /*sarimax_exec(object, input time series, exogenous time series)
        set exogenous to NULL if deadling only with a univariate time series.
    */
	sarimax_exec(obj, inp,NULL);
	sarimax_summary(obj);
	/* sarimax_predict(sarimax_object obj, double *inp, double *xreg, int L,double *newxreg, double *xpred, double *amse)
        inp - Input Time Series
        xreg - Exogenous Time Series
        L - L point prediction
        newxreg - Exogenous Time Series of dimension r * L where r is the number of exogenus time series and L is the length of each
        xpred - L future values
        amse - MSE for L future values
    */
	sarimax_predict(obj, inp, NULL, L, NULL, xpred, amse);
	printf("\n");
	printf("Predicted Values : ");
	for (i = 0; i < L; ++i) {
		printf("%g ", exp(xpred[i]));
	}
	printf("\n");
	printf("Standard Errors  : ");
	for (i = 0; i < L; ++i) {
		printf("%g ", sqrt(amse[i]));
	}
	printf("\n");
	sarimax_free(obj);
	free(inp);
	free(phi);
	free(theta);
    free(PHI);
	free(THETA);
	free(xpred);
	free(amse);
	return 0;

}